

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseVariantsElement
          (AsciiParser *this,string *out_key,string *out_var)

{
  bool bVar1;
  ostream *poVar2;
  string local_558;
  ostringstream local_538 [8];
  ostringstream ss_e_2;
  undefined1 local_3c0 [8];
  string var;
  ostringstream local_380 [8];
  ostringstream ss_e_1;
  undefined1 local_208 [8];
  string key_name;
  ostringstream local_1c8 [8];
  ostringstream ss_e;
  undefined1 local_48 [8];
  string type_name;
  string *out_var_local;
  string *out_key_local;
  AsciiParser *this_local;
  
  type_name.field_2._8_8_ = out_var;
  ::std::__cxx11::string::string((string *)local_48);
  bVar1 = ReadIdentifier(this,(string *)local_48);
  if (bVar1) {
    bVar1 = ::std::operator!=((ParseState *)local_48,"string");
    if (bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar2 = ::std::operator<<((ostream *)local_1c8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseVariantsElement");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,999);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1c8,
                                 "TinyUSDZ only accepts type `string` for `variants` element.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)((long)&key_name.field_2 + 8));
      ::std::__cxx11::string::~string((string *)(key_name.field_2._M_local_buf + 8));
      this_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
    }
    else {
      bVar1 = SkipWhitespace(this);
      if (bVar1) {
        ::std::__cxx11::string::string((string *)local_208);
        bVar1 = ReadIdentifier(this,(string *)local_208);
        if ((bVar1) || (bVar1 = ReadStringLiteral(this,(string *)local_208), bVar1)) {
          bVar1 = SkipWhitespace(this);
          if (bVar1) {
            bVar1 = Expect(this,'=');
            if (bVar1) {
              bVar1 = SkipWhitespace(this);
              if (bVar1) {
                ::std::__cxx11::string::string((string *)local_3c0);
                this_local._7_1_ = ReadBasicType(this,(string *)local_3c0);
                if (this_local._7_1_) {
                  ::std::__cxx11::string::operator=((string *)out_key,(string *)local_208);
                  ::std::__cxx11::string::operator=
                            ((string *)type_name.field_2._8_8_,(string *)local_3c0);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_538);
                  poVar2 = ::std::operator<<((ostream *)local_538,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"ParseVariantsElement");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x406);
                  ::std::operator<<(poVar2," ");
                  poVar2 = ::std::operator<<((ostream *)local_538,"Failed to parse `string`");
                  ::std::operator<<(poVar2,"\n");
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,&local_558);
                  ::std::__cxx11::string::~string((string *)&local_558);
                  ::std::__cxx11::ostringstream::~ostringstream(local_538);
                }
                ::std::__cxx11::string::~string((string *)local_3c0);
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_380);
          poVar2 = ::std::operator<<((ostream *)local_380,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParseVariantsElement");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3f4);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_380,
                                     "Failed to parse dictionary key identifier.\n");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)((long)&var.field_2 + 8));
          ::std::__cxx11::string::~string((string *)(var.field_2._M_local_buf + 8));
          this_local._7_1_ = false;
          ::std::__cxx11::ostringstream::~ostringstream(local_380);
        }
        ::std::__cxx11::string::~string((string *)local_208);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  ::std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ParseVariantsElement(std::string *out_key,
                                       std::string *out_var) {
  // variants_element: string name '=' value
  //           ;

  std::string type_name;

  if (!ReadIdentifier(&type_name)) {
    return false;
  }

  // must be `string`
  if (type_name != value::kString) {
    PUSH_ERROR_AND_RETURN(
        "TinyUSDZ only accepts type `string` for `variants` element.");
  }

  if (!SkipWhitespace()) {
    return false;
  }

  std::string key_name;
  if (!ReadIdentifier(&key_name)) {
    // string literal is also supported. e.g. "0"
    if (ReadStringLiteral(&key_name)) {
      // ok
    } else {
      PUSH_ERROR_AND_RETURN("Failed to parse dictionary key identifier.\n");
    }
  }

  if (!SkipWhitespace()) {
    return false;
  }

  if (!Expect('=')) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  std::string var;
  if (!ReadBasicType(&var)) {
    PUSH_ERROR_AND_RETURN("Failed to parse `string`");
  }

  DCOUT("key: " << key_name << ", value: " << var);

  (*out_key) = key_name;
  (*out_var) = var;

  return true;
}